

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall
HighsCliqueTable::bronKerboschRecurse
          (HighsCliqueTable *this,BronKerboschData *data,HighsInt Plen,CliqueVar *X,HighsInt Xlen)

{
  pointer *ppCVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  iterator __position;
  iterator __position_00;
  pointer pCVar3;
  bool bVar4;
  vector<int,std::allocator<int>> *neighbourhoodInds;
  HighsCliqueTable *this_00;
  int iVar5;
  CliqueVar CVar6;
  HighsInt Plen_00;
  HighsInt Xlen_00;
  long lVar7;
  int iVar8;
  CliqueVar *pCVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int *piVar15;
  pointer pCVar16;
  int64_t *numQueries;
  double dVar17;
  double dVar18;
  double dVar19;
  CliqueVar v;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> PminusNu;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> localX;
  vector<int,_std::allocator<int>_> *__range1;
  CliqueVar local_a8;
  int local_a4;
  double local_a0;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_98;
  vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *local_80;
  CliqueVar *local_78;
  int *local_70;
  CliqueVar *local_68;
  iterator iStack_60;
  CliqueVar *local_58;
  vector<int,std::allocator<int>> *local_48;
  int64_t *local_40;
  HighsCliqueTable *local_38;
  
  local_a0 = data->wR;
  if (Plen != 0) {
    uVar12 = 0;
    do {
      CVar6 = (data->P).
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar12];
      if ((int)CVar6 < 0) {
        dVar18 = (data->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[(uint)CVar6 & 0x7fffffff];
      }
      else {
        dVar18 = 1.0 - (data->sol->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[(uint)CVar6];
      }
      local_a0 = local_a0 + dVar18;
      uVar12 = uVar12 + 1;
    } while ((uint)Plen != uVar12);
  }
  dVar18 = data->feastol;
  if (data->minW - dVar18 <= local_a0) {
    local_a4 = Plen;
    if (Xlen == 0 && Plen == 0) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::vector
                (&local_98,&data->R);
      dVar18 = local_a0 - data->feastol;
      if (data->minW <= dVar18 && dVar18 != data->minW) {
        data->maxcliques =
             data->maxcliques +
             (int)((ulong)((long)(data->cliques).
                                 super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(data->cliques).
                                super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x55555555;
        std::
        vector<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
        ::clear(&data->cliques);
        data->minW = local_a0;
      }
      std::
      vector<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>,std::allocator<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
      ::
      emplace_back<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>
                ((vector<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>,std::allocator<std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                  *)&data->cliques,&local_98);
    }
    else {
      iVar5 = data->ncalls + 1;
      data->ncalls = iVar5;
      if (data->maxcalls == iVar5) {
        return;
      }
      if (data->maxcliques ==
          (int)((ulong)((long)(data->cliques).
                              super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(data->cliques).
                             super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        return;
      }
      if (data->maxNeighbourhoodQueries < data->numNeighbourhoodQueries) {
        return;
      }
      if (Xlen == 0) {
        dVar17 = -1.0;
        uVar12 = 0;
      }
      else {
        pvVar2 = data->sol;
        uVar13 = 0;
        dVar17 = -1.0;
        uVar14 = 0;
        do {
          CVar6 = X[uVar13];
          uVar12 = (ulong)(uint)CVar6;
          if ((int)CVar6 < 0) {
            dVar19 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(uint)CVar6 & 0x7fffffff];
          }
          else {
            dVar19 = 1.0 - (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[uVar12];
          }
          if (dVar17 < dVar19) {
            if ((int)CVar6 < 0) {
              dVar17 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[(uint)CVar6 & 0x7fffffff];
            }
            else {
              dVar17 = 1.0 - (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start[uVar12];
            }
            uVar14 = (ulong)(uint)CVar6;
            if (1.0 - dVar18 <= dVar17) break;
          }
          uVar12 = uVar14;
          uVar13 = uVar13 + 1;
          uVar14 = uVar12;
        } while ((uint)Xlen != uVar13);
      }
      CVar6 = SUB84(uVar12,0);
      if (Plen != 0 && dVar17 < 1.0 - dVar18) {
        pvVar2 = data->sol;
        uVar14 = 0;
        do {
          CVar6 = (data->P).
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar14];
          if ((int)CVar6 < 0) {
            dVar19 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[(uint)CVar6 & 0x7fffffff];
          }
          else {
            dVar19 = 1.0 - (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start[(uint)CVar6];
          }
          if (dVar17 < dVar19) {
            if ((int)CVar6 < 0) {
              dVar17 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start[(uint)CVar6 & 0x7fffffff];
            }
            else {
              dVar17 = 1.0 - (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start[(uint)CVar6];
            }
            uVar12 = (ulong)(uint)CVar6;
            if (1.0 - dVar18 <= dVar17) break;
          }
          CVar6 = SUB84(uVar12,0);
          uVar14 = uVar14 + 1;
        } while ((uint)Plen != uVar14);
      }
      local_98.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start = (CliqueVar *)0x0;
      local_98.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_finish = (CliqueVar *)0x0;
      local_98.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (CliqueVar *)0x0;
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      reserve(&local_98,(long)Plen);
      local_48 = (vector<int,std::allocator<int>> *)&data->neighbourhoodInds;
      local_40 = &data->numNeighbourhoodQueries;
      queryNeighbourhood(this,(vector<int,_std::allocator<int>_> *)local_48,local_40,CVar6,
                         (data->P).
                         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                         ._M_impl.super__Vector_impl_data._M_start,local_a4);
      __position._M_current =
           (data->neighbourhoodInds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (data->neighbourhoodInds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_48,__position,&local_a4);
      }
      else {
        *__position._M_current = local_a4;
        (data->neighbourhoodInds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      local_80 = (vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
                 CONCAT44(local_80._4_4_,Xlen);
      piVar15 = (data->neighbourhoodInds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_70 = (data->neighbourhoodInds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_78 = X;
      local_38 = this;
      if (piVar15 != local_70) {
        iVar5 = 0;
        do {
          iVar8 = *piVar15;
          if (iVar5 < iVar8) {
            lVar10 = (long)iVar5 << 2;
            do {
              pCVar9 = (CliqueVar *)
                       (&((data->P).
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar10);
              if (local_98.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_98.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                ::_M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                          ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                            *)&local_98,
                           (iterator)
                           local_98.
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_finish,pCVar9);
              }
              else {
                *local_98.
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 ._M_impl.super__Vector_impl_data._M_finish = *pCVar9;
                local_98.
                super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_98.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              lVar10 = lVar10 + 4;
              iVar5 = iVar5 + 1;
            } while (iVar8 != iVar5);
          }
          iVar5 = iVar5 + 1;
          piVar15 = piVar15 + 1;
        } while (piVar15 != local_70);
      }
      this_00 = local_38;
      neighbourhoodInds = local_48;
      pCVar9 = local_78;
      iVar5 = (int)local_80;
      if (local_98.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_98.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar12 = (long)local_98.
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2;
        iVar8 = 0;
        if (1 < uVar12) {
          iVar8 = 0;
          do {
            uVar12 = (long)uVar12 >> 1;
            iVar8 = iVar8 + 1;
          } while (1 < uVar12);
        }
        pdqsort_detail::
        pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::bronKerboschRecurse(HighsCliqueTable::BronKerboschData&,int,HighsCliqueTable::CliqueVar_const*,int)const::__0,false>
                  ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    )local_98.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    )local_98.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_898a9ca8)data,iVar8,
                   true);
      }
      local_68 = (CliqueVar *)0x0;
      iStack_60._M_current = (CliqueVar *)0x0;
      local_58 = (CliqueVar *)0x0;
      std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
      _M_range_insert<HighsCliqueTable::CliqueVar_const*>
                ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>> *)
                 &local_68,0,pCVar9,pCVar9 + iVar5);
      local_78 = local_98.
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (local_98.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_98.
          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_80 = (vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    *)&data->R;
        pCVar16 = local_98.
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        numQueries = local_40;
        do {
          local_a8 = *pCVar16;
          Plen_00 = partitionNeighbourhood
                              (this_00,(vector<int,_std::allocator<int>_> *)neighbourhoodInds,
                               numQueries,local_a8,
                               (data->P).
                               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                               ._M_impl.super__Vector_impl_data._M_start,local_a4);
          Xlen_00 = partitionNeighbourhood
                              (this_00,(vector<int,_std::allocator<int>_> *)neighbourhoodInds,
                               numQueries,local_a8,local_68,
                               (HighsInt)((ulong)((long)iStack_60._M_current - (long)local_68) >> 2)
                              );
          __position_00._M_current =
               (data->R).
               super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position_00._M_current ==
              (data->R).
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
            _M_realloc_insert<HighsCliqueTable::CliqueVar_const&>(local_80,__position_00,&local_a8);
          }
          else {
            *__position_00._M_current = local_a8;
            ppCVar1 = &(data->R).
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppCVar1 = *ppCVar1 + 1;
          }
          if ((int)local_a8 < 0) {
            local_70 = (int *)(data->sol->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start[(uint)local_a8 & 0x7fffffff];
          }
          else {
            local_70 = (int *)(1.0 - (data->sol->super__Vector_base<double,_std::allocator<double>_>
                                     )._M_impl.super__Vector_impl_data._M_start[(uint)local_a8]);
          }
          data->wR = data->wR + (double)local_70;
          bronKerboschRecurse(this_00,data,Plen_00,local_68,Xlen_00);
          numQueries = local_40;
          bVar4 = true;
          if (((data->maxcalls != data->ncalls) &&
              (data->maxcliques !=
               (int)((ulong)((long)(data->cliques).
                                   super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(data->cliques).
                                  super__Vector_base<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>,_std::allocator<std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555))
             && (data->numNeighbourhoodQueries <= data->maxNeighbourhoodQueries)) {
            ppCVar1 = &(data->R).
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppCVar1 = *ppCVar1 + -1;
            data->wR = data->wR - (double)local_70;
            local_a0 = local_a0 - (double)local_70;
            if (data->minW <= local_a0) {
              lVar7 = (long)local_a4;
              lVar10 = -1;
              if (local_a4 != Plen_00) {
                lVar11 = (long)Plen_00;
                iVar5 = local_a4 - Plen_00;
                do {
                  lVar10 = lVar11;
                  if ((data->P).
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start[lVar11] == local_a8) break;
                  lVar11 = lVar11 + 1;
                  iVar5 = iVar5 + -1;
                  lVar10 = -1;
                } while (iVar5 != 0);
              }
              local_a4 = local_a4 + -1;
              pCVar3 = (data->P).
                       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              CVar6 = pCVar3[lVar10];
              pCVar3[lVar10] = pCVar3[lVar7 + -1];
              pCVar3[lVar7 + -1] = CVar6;
              if (iStack_60._M_current == local_58) {
                std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                ::_M_realloc_insert<HighsCliqueTable::CliqueVar_const&>
                          ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                            *)&local_68,iStack_60,&local_a8);
              }
              else {
                *iStack_60._M_current = local_a8;
                iStack_60._M_current = iStack_60._M_current + 1;
              }
              bVar4 = false;
            }
          }
        } while ((!bVar4) && (pCVar16 = pCVar16 + 1, pCVar16 != local_78));
      }
      if (local_68 != (CliqueVar *)0x0) {
        operator_delete(local_68);
      }
    }
    if (local_98.
        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
        ._M_impl.super__Vector_impl_data._M_start != (CliqueVar *)0x0) {
      operator_delete(local_98.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HighsCliqueTable::bronKerboschRecurse(BronKerboschData& data,
                                           HighsInt Plen, const CliqueVar* X,
                                           HighsInt Xlen) const {
  double w = data.wR;

  for (HighsInt i = 0; i != Plen; ++i) w += data.P[i].weight(data.sol);

  if (w < data.minW - data.feastol) return;

  if (Plen == 0 && Xlen == 0) {
    std::vector<CliqueVar> clique = data.R;

    if (data.minW < w - data.feastol) {
      data.maxcliques -= data.cliques.size();
      data.cliques.clear();
      data.minW = w;
    }
    data.cliques.emplace_back(std::move(clique));
    // do not further search for cliques that are violated less than this
    // current clique
    return;
  }

  ++data.ncalls;

  if (data.stop()) return;

  double pivweight = -1.0;
  CliqueVar pivot{0, 0};

  for (HighsInt i = 0; i != Xlen; ++i) {
    if (X[i].weight(data.sol) > pivweight) {
      pivweight = X[i].weight(data.sol);
      pivot = X[i];
      if (pivweight >= 1.0 - data.feastol) break;
    }
  }

  if (pivweight < 1.0 - data.feastol) {
    for (HighsInt i = 0; i != Plen; ++i) {
      if (data.P[i].weight(data.sol) > pivweight) {
        pivweight = data.P[i].weight(data.sol);
        pivot = data.P[i];
        if (pivweight >= 1.0 - data.feastol) break;
      }
    }
  }

  std::vector<CliqueVar> PminusNu;
  PminusNu.reserve(Plen);
  queryNeighbourhood(data.neighbourhoodInds, data.numNeighbourhoodQueries,
                     pivot, data.P.data(), Plen);
  data.neighbourhoodInds.push_back(Plen);
  HighsInt k = 0;
  for (HighsInt i : data.neighbourhoodInds) {
    while (k < i) PminusNu.push_back(data.P[k++]);
    ++k;
  }

  pdqsort(PminusNu.begin(), PminusNu.end(), [&](CliqueVar a, CliqueVar b) {
    return std::make_pair(a.weight(data.sol), a.index()) >
           std::make_pair(b.weight(data.sol), b.index());
  });

  std::vector<CliqueVar> localX;
  localX.insert(localX.end(), X, X + Xlen);

  for (CliqueVar v : PminusNu) {
    HighsInt newPlen = partitionNeighbourhood(data.neighbourhoodInds,
                                              data.numNeighbourhoodQueries, v,
                                              data.P.data(), Plen);
    HighsInt newXlen = partitionNeighbourhood(data.neighbourhoodInds,
                                              data.numNeighbourhoodQueries, v,
                                              localX.data(), localX.size());

    // add v to R, update the weight, and do the recursive call
    data.R.push_back(v);
    double wv = v.weight(data.sol);
    data.wR += wv;
    bronKerboschRecurse(data, newPlen, localX.data(), newXlen);
    if (data.stop()) return;

    // remove v from R restore the weight and continue the loop in this call
    data.R.pop_back();
    data.wR -= wv;

    w -= wv;
    if (w < data.minW) return;
    // find the position of v in the vertices removed from P for the recursive
    // call
    // and also remove it from the set P for this call
    HighsInt vpos = -1;
    for (HighsInt i = newPlen; i != Plen; ++i) {
      if (data.P[i] == v) {
        vpos = i;
        break;
      }
    }

    // do the removal by first swapping it to the end of P and reduce the size
    // of P accordingly
    assert(vpos != -1);

    --Plen;
    std::swap(data.P[vpos], data.P[Plen]);

    localX.push_back(v);
  }
}